

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReactorCvode.cpp
# Opt level: O2

void __thiscall
pele::physics::reactions::ReactorCvode::allocUserData
          (ReactorCvode *this,CVODEUserData *udata,int a_ncells)

{
  int iVar1;
  uint uVar2;
  sunindextype NNZ;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  Arena *pAVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Context *pCVar7;
  SUNMatrix p_Var8;
  sunindextype *psVar9;
  Real ****ppppRVar10;
  sunindextype ***pppsVar11;
  Real ***pppRVar12;
  sunindextype **ppsVar13;
  int **ppiVar14;
  SUNMatrix *pp_Var15;
  Real **ppRVar16;
  realtype *prVar17;
  Real *pRVar18;
  realtype **pprVar19;
  ostream *os_;
  int M;
  char *pcVar20;
  ulong uVar21;
  ulong uVar22;
  int i;
  long lVar23;
  ulong uVar24;
  int i_1;
  ulong uVar25;
  string solve_type_str;
  string prec_type_str;
  ParmParse ppcv;
  int HP;
  ostream local_1a8 [376];
  
  std::__cxx11::string::string((string *)&solve_type_str,"none",(allocator *)&HP);
  std::__cxx11::string::string((string *)&HP,"cvode",(allocator *)&prec_type_str);
  amrex::ParmParse::ParmParse(&ppcv,(string *)&HP);
  std::__cxx11::string::~string((string *)&HP);
  udata->maxOrder = 2;
  amrex::ParmParse::query(&ppcv,"max_order",&udata->maxOrder,0);
  amrex::ParmParse::query(&ppcv,"solve_type",&solve_type_str,0);
  udata->analytical_jacobian = 0;
  udata->solve_type = -1;
  udata->precond_type = -1;
  bVar3 = std::operator==(&solve_type_str,"fixed_point");
  if (bVar3) {
    udata->analytical_jacobian = 0;
    udata->solve_type = 0;
    goto LAB_001b3bfc;
  }
  bVar3 = std::operator==(&solve_type_str,"dense_direct");
  if (bVar3) {
    udata->solve_type = 1;
    goto LAB_001b3bfc;
  }
  bVar3 = std::operator==(&solve_type_str,"denseAJ_direct");
  if (bVar3) {
    uVar5 = 0x200000001;
  }
  else {
    bVar3 = std::operator==(&solve_type_str,"sparse_direct");
    if (bVar3) {
      udata->analytical_jacobian = 1;
      udata->solve_type = 3;
      pcVar20 = "solver_type sparse_direct requires the KLU library";
LAB_001b3bf7:
      amrex::Abort_host(pcVar20);
      goto LAB_001b3bfc;
    }
    bVar3 = std::operator==(&solve_type_str,"custom_direct");
    if (!bVar3) {
      bVar3 = std::operator==(&solve_type_str,"GMRES");
      if (bVar3) {
        udata->solve_type = 5;
        goto LAB_001b3bfc;
      }
      bVar3 = std::operator==(&solve_type_str,"precGMRES");
      if (!bVar3) {
        pcVar20 = 
        "Wrong solve_type. Options are: \'dense_direct\', denseAJ_direct\', \'sparse_direct\', \'custom_direct\', \'GMRES\', \'precGMRES\', \'fixed_point\'"
        ;
        goto LAB_001b3bf7;
      }
      udata->solve_type = 6;
      std::__cxx11::string::string
                ((string *)&prec_type_str,"sparse_simplified_AJacobian",(allocator *)&HP);
      iVar4 = 0;
      amrex::ParmParse::query(&ppcv,"precond_type",&prec_type_str,0);
      bVar3 = std::operator==(&prec_type_str,"dense_simplified_AJacobian");
      if (bVar3) {
LAB_001b4032:
        udata->precond_type = iVar4;
      }
      else {
        bVar3 = std::operator==(&prec_type_str,"sparse_simplified_AJacobian");
        if (bVar3) {
          udata->precond_type = 1;
          pcVar20 = "precond_type sparse_simplified_AJacobian requires the KLU library";
        }
        else {
          bVar3 = std::operator==(&prec_type_str,"custom_simplified_AJacobian");
          if (bVar3) {
            iVar4 = 2;
            goto LAB_001b4032;
          }
          pcVar20 = 
          "Wrong precond_type. Options are: \'dense_simplified_AJacobian\', \'sparse_simplified_AJacobian\', \'custom_simplified_AJacobian\'"
          ;
        }
        amrex::Abort_host(pcVar20);
      }
      os_ = amrex::OutStream();
      amrex::Print::Print((Print *)&HP,os_);
      std::operator<<(local_1a8,"\n");
      amrex::Print::~Print((Print *)&HP);
      std::__cxx11::string::~string((string *)&prec_type_str);
      goto LAB_001b3bfc;
    }
    uVar5 = 0x400000001;
  }
  udata->analytical_jacobian = (int)uVar5;
  udata->solve_type = (int)((ulong)uVar5 >> 0x20);
LAB_001b3bfc:
  HP = (int)(this->m_reactor_type == 2);
  udata->reactor_type = this->m_reactor_type;
  udata->ncells = a_ncells;
  udata->verbose =
       (this->super_Register<pele::physics::reactions::ReactorCvode>).super_ReactorBase.verbose;
  pAVar6 = amrex::The_Arena();
  iVar4 = (*pAVar6->_vptr_Arena[2])(pAVar6,(long)(a_ncells * 0x15) << 3);
  udata->rYsrc_ext = (Real *)CONCAT44(extraout_var,iVar4);
  pAVar6 = amrex::The_Arena();
  lVar23 = (long)a_ncells * 8;
  iVar4 = (*pAVar6->_vptr_Arena[2])(pAVar6,lVar23);
  udata->rhoe_init = (Real *)CONCAT44(extraout_var_00,iVar4);
  pAVar6 = amrex::The_Arena();
  iVar4 = (*pAVar6->_vptr_Arena[2])(pAVar6,lVar23);
  udata->rhoesrc_ext = (Real *)CONCAT44(extraout_var_01,iVar4);
  pAVar6 = amrex::The_Arena();
  lVar23 = (long)a_ncells << 2;
  iVar4 = (*pAVar6->_vptr_Arena[2])(pAVar6,lVar23);
  udata->mask = (int *)CONCAT44(extraout_var_02,iVar4);
  pAVar6 = amrex::The_Arena();
  iVar4 = (*pAVar6->_vptr_Arena[2])(pAVar6,lVar23);
  udata->FCunt = (int *)CONCAT44(extraout_var_03,iVar4);
  udata->FirstTimePrecond = true;
  if (udata->solve_type == 4) {
    SPARSITY_INFO_SYST(&udata->NNZ,&HP,udata->ncells);
    iVar4 = udata->ncells;
    iVar1 = udata->NNZ;
    pCVar7 = amrex::sundials::The_Sundials_Context(0);
    M = iVar4 * 0x16;
    p_Var8 = SUNSparseMatrix(M,M,iVar1 * iVar4,1,
                             *(pCVar7->sunctx_)._M_t.
                              super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                              ._M_t.
                              super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                              .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
    udata->PSc = p_Var8;
    psVar9 = SUNSparseMatrix_IndexPointers(p_Var8);
    udata->rowPtrs_c = psVar9;
    psVar9 = SUNSparseMatrix_IndexValues(udata->PSc);
    udata->colVals_c = psVar9;
    SPARSITY_PREPROC_SYST_CSR(psVar9,udata->rowPtrs_c,&HP,udata->ncells,0);
  }
  if (udata->precond_type == 2) {
    uVar24 = 0xffffffffffffffff;
    if (-1 < (long)udata->ncells) {
      uVar24 = (long)udata->ncells * 8;
    }
    ppiVar14 = (int **)operator_new__(uVar24);
    udata->colVals = ppiVar14;
    ppiVar14 = (int **)operator_new__(uVar24);
    udata->rowPtrs = ppiVar14;
    pp_Var15 = (SUNMatrix *)operator_new__(uVar24);
    udata->PS = pp_Var15;
    ppRVar16 = (Real **)operator_new__(uVar24);
    udata->JSPSmat = ppRVar16;
    SPARSITY_INFO_SYST_SIMPLIFIED(&udata->NNZ,&HP);
    for (lVar23 = 0; lVar23 < udata->ncells; lVar23 = lVar23 + 1) {
      NNZ = udata->NNZ;
      pCVar7 = amrex::sundials::The_Sundials_Context(0);
      p_Var8 = SUNSparseMatrix(0x16,0x16,NNZ,1,
                               *(pCVar7->sunctx_)._M_t.
                                super___uniq_ptr_impl<_SUNContext_*,_std::default_delete<_SUNContext_*>_>
                                ._M_t.
                                super__Tuple_impl<0UL,__SUNContext_**,_std::default_delete<_SUNContext_*>_>
                                .super__Head_base<0UL,__SUNContext_**,_false>._M_head_impl);
      udata->PS[lVar23] = p_Var8;
      psVar9 = SUNSparseMatrix_IndexPointers(udata->PS[lVar23]);
      udata->rowPtrs[lVar23] = psVar9;
      psVar9 = SUNSparseMatrix_IndexValues(udata->PS[lVar23]);
      udata->colVals[lVar23] = psVar9;
      prVar17 = SUNSparseMatrix_Data(udata->PS[lVar23]);
      udata->Jdata[lVar23] = prVar17;
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(udata->colVals[lVar23],udata->rowPtrs[lVar23],&HP,0);
      pRVar18 = (Real *)operator_new__(0xf20);
      udata->JSPSmat[lVar23] = pRVar18;
    }
  }
  else if (udata->precond_type == 0) {
    uVar2 = udata->ncells;
    uVar25 = (ulong)(int)uVar2;
    uVar24 = 0xffffffffffffffff;
    if (-1 < (long)uVar25) {
      uVar24 = uVar25 * 8;
    }
    ppppRVar10 = (Real ****)operator_new__(uVar24);
    udata->P = ppppRVar10;
    ppppRVar10 = (Real ****)operator_new__(uVar24);
    udata->Jbd = ppppRVar10;
    pppsVar11 = (sunindextype ***)operator_new__(uVar24);
    udata->pivot = pppsVar11;
    uVar21 = 0;
    uVar22 = 0;
    if (0 < (int)uVar2) {
      uVar22 = (ulong)uVar2;
    }
    for (; uVar22 != uVar21; uVar21 = uVar21 + 1) {
      pppRVar12 = (Real ***)operator_new__(uVar24);
      udata->P[uVar21] = pppRVar12;
      pppRVar12 = (Real ***)operator_new__(uVar24);
      udata->Jbd[uVar21] = pppRVar12;
      ppsVar13 = (sunindextype **)operator_new__(uVar24);
      udata->pivot[uVar21] = ppsVar13;
    }
    for (lVar23 = 0; lVar23 < (int)uVar25; lVar23 = lVar23 + 1) {
      pprVar19 = SUNDlsMat_newDenseMat(0x16,0x16);
      udata->P[lVar23][lVar23] = pprVar19;
      pprVar19 = SUNDlsMat_newDenseMat(0x16,0x16);
      udata->Jbd[lVar23][lVar23] = pprVar19;
      psVar9 = SUNDlsMat_newIndexArray(0x16);
      udata->pivot[lVar23][lVar23] = psVar9;
      uVar25 = (ulong)(uint)udata->ncells;
    }
  }
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&ppcv);
  std::__cxx11::string::~string((string *)&solve_type_str);
  return;
}

Assistant:

void
ReactorCvode::allocUserData(
  CVODEUserData* udata,
  int a_ncells
#ifdef AMREX_USE_GPU
  ,
  SUNMatrix& a_A,
  amrex::gpuStream_t stream
#endif
) const
{
  // Query options
  std::string solve_type_str = "none";
  amrex::ParmParse ppcv("cvode");
  udata->maxOrder = 2;
  ppcv.query("max_order", udata->maxOrder);
  ppcv.query("solve_type", solve_type_str);
  // Defaults
  udata->solve_type = -1;
  udata->analytical_jacobian = 0;
  udata->precond_type = -1;

#ifdef AMREX_USE_GPU
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "magma_direct") {
    udata->solve_type = cvode::magmaDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "cuSparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "cuSparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Only option is: 'cuSparse_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'sparse_direct', 'custom_direct', "
      "'GMRES', 'precGMRES', 'fixed_point'");
  }

#else
  if (solve_type_str == "fixed_point") {
    udata->solve_type = cvode::fixedPoint;
    udata->analytical_jacobian = 0;
  } else if (solve_type_str == "dense_direct") {
    udata->solve_type = cvode::denseFDDirect;
  } else if (solve_type_str == "denseAJ_direct") {
    udata->solve_type = cvode::denseDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "sparse_direct") {
    udata->solve_type = cvode::sparseDirect;
    udata->analytical_jacobian = 1;
#ifndef PELE_USE_KLU
    amrex::Abort("solver_type sparse_direct requires the KLU library");
#endif
  } else if (solve_type_str == "custom_direct") {
    udata->solve_type = cvode::customDirect;
    udata->analytical_jacobian = 1;
  } else if (solve_type_str == "GMRES") {
    udata->solve_type = cvode::GMRES;
  } else if (solve_type_str == "precGMRES") {
    udata->solve_type = cvode::precGMRES;
    std::string prec_type_str = "sparse_simplified_AJacobian";
    ppcv.query("precond_type", prec_type_str);
    if (prec_type_str == "dense_simplified_AJacobian") {
      udata->precond_type = cvode::denseSimpleAJac;
    } else if (prec_type_str == "sparse_simplified_AJacobian") {
      udata->precond_type = cvode::sparseSimpleAJac;
#ifndef PELE_USE_KLU
      amrex::Abort(
        "precond_type sparse_simplified_AJacobian requires the KLU library");
#endif
    } else if (prec_type_str == "custom_simplified_AJacobian") {
      udata->precond_type = cvode::customSimpleAJac;
    } else {
      amrex::Abort(
        "Wrong precond_type. Options are: 'dense_simplified_AJacobian', "
        "'sparse_simplified_AJacobian', 'custom_simplified_AJacobian'");
    }
    amrex::Print() << "\n";
  } else {
    amrex::Abort(
      "Wrong solve_type. Options are: 'dense_direct', denseAJ_direct', "
      "'sparse_direct', 'custom_direct', 'GMRES', 'precGMRES', 'fixed_point'");
  }
#endif

  // Pass options to udata
  const int HP =
    static_cast<int>(m_reactor_type == ReactorTypes::h_reactor_type);
  int nspec_tot = (NUM_SPECIES)*a_ncells;
  udata->reactor_type = m_reactor_type;
  udata->ncells = a_ncells;
  udata->verbose = verbose;
#ifdef AMREX_USE_GPU
  udata->nbThreads = 32;
  udata->nbBlocks = std::max(1, a_ncells / udata->nbThreads);
  udata->stream = stream;
#endif

  // Alloc internal udata solution/forcing containers
  udata->rYsrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(nspec_tot * sizeof(amrex::Real)));
  udata->rhoe_init = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->rhoesrc_ext = static_cast<amrex::Real*>(
    amrex::The_Arena()->alloc(a_ncells * sizeof(amrex::Real)));
  udata->mask =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));

#ifndef AMREX_USE_GPU
  udata->FCunt =
    static_cast<int*>(amrex::The_Arena()->alloc(a_ncells * sizeof(int)));
  udata->FirstTimePrecond = true;
#endif

  // Alloc internal udata Analytical Jacobian containers
#ifdef AMREX_USE_GPU
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int)));
    udata->csr_col_index_h = static_cast<int*>(
      amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int)));

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    if (utils::check_flag((void*)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0)) {
      amrex::Abort("Something went wrong while creating cuSparse_NewBlockCSR");
    }

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
    int sunMatFlag = SUNMatrix_cuSparse_CopyToDevice(
      a_A, nullptr, udata->csr_row_count_h, udata->csr_col_index_h);
    if (sunMatFlag != SUNMAT_SUCCESS) {
      amrex::Print()
        << " Something went wrong in SUNMatrix_cuSparse_CopyToDevice \n";
    }
#else
    amrex::Abort(
      "Solver_type sparse_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::customDirect) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, 1);
    udata->csr_row_count_h =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreate(&(udata->cuSPHandle));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status = cusparseSetStream(udata->cuSPHandle, stream);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);

    a_A = SUNMatrix_cuSparse_NewBlockCSR(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), udata->NNZ,
      udata->cuSPHandle, *amrex::sundials::The_Sundials_Context());
    // if (utils::check_flag((void *)a_A, "SUNMatrix_cuSparse_NewBlockCSR", 0))
    // return(1);

    int retval = SUNMatrix_cuSparse_SetFixedPattern(a_A, 1);
    // if(utils::check_flag(&retval, "SUNMatrix_cuSparse_SetFixedPattern", 1))
    // return(1);

    SPARSITY_PREPROC_SYST_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1, 0);
#else
    amrex::Abort(
      "Solver_type custom_direct is only available with CUDA on GPU");
#endif
  } else if (udata->solve_type == cvode::magmaDirect) {
#ifdef PELE_USE_MAGMA
    a_A = SUNMatrix_MagmaDenseBlock(
      a_ncells, (NUM_SPECIES + 1), (NUM_SPECIES + 1), SUNMEMTYPE_DEVICE,
      *amrex::sundials::The_SUNMemory_Helper(), nullptr,
      *amrex::sundials::The_Sundials_Context());
#else
    amrex::Abort("Solver_type magma_direct reauires PELE_USE_MAGMA = TRUE");
#endif
  }

#else
  if (udata->solve_type == cvode::sparseDirect) {
#ifdef PELE_USE_KLU
    // CSC matrices data -> one big matrix used for the direct solve
    udata->colPtrs = new int*[1];
    udata->rowVals = new int*[1];
    udata->Jdata = new amrex::Real*[1];

    // Number of non zero elements in ODE system
    SPARSITY_INFO(&(udata->NNZ), &HP, udata->ncells);
    // Build Sparse Matrix for direct sparse KLU solver
    (udata->PS) = new SUNMatrix[1];
    (udata->PS)[0] = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSC_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->colPtrs[0] =
      static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[0]));
    udata->rowVals[0] =
      static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[0]));
    udata->Jdata[0] = SUNSparseMatrix_Data((udata->PS)[0]);
    SPARSITY_PREPROC_CSC(
      udata->rowVals[0], udata->colPtrs[0], &HP, udata->ncells);
#endif
  } else if (udata->solve_type == cvode::customDirect) {
    // Number of non zero elements in ODE system
    SPARSITY_INFO_SYST(&(udata->NNZ), &HP, udata->ncells);
    // Build the SUNmatrix as CSR sparse and fill ptrs to row/Vals
    udata->PSc = SUNSparseMatrix(
      (NUM_SPECIES + 1) * udata->ncells, (NUM_SPECIES + 1) * udata->ncells,
      udata->NNZ * udata->ncells, CSR_MAT,
      *amrex::sundials::The_Sundials_Context());
    udata->rowPtrs_c =
      static_cast<int*>(SUNSparseMatrix_IndexPointers(udata->PSc));
    udata->colVals_c =
      static_cast<int*>(SUNSparseMatrix_IndexValues(udata->PSc));
    SPARSITY_PREPROC_SYST_CSR(
      udata->colVals_c, udata->rowPtrs_c, &HP, udata->ncells, 0);
  }
#endif

  // Alloc internal udata Preconditioner containers
#ifdef AMREX_USE_GPU
  if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef AMREX_USE_CUDA
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    udata->csr_row_count_h =
      (int*)amrex::The_Pinned_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_h =
      (int*)amrex::The_Pinned_Arena()->alloc(udata->NNZ * sizeof(int));

    udata->csr_row_count_d =
      (int*)amrex::The_Arena()->alloc((NUM_SPECIES + 2) * sizeof(int));
    udata->csr_col_index_d =
      (int*)amrex::The_Arena()->alloc(udata->NNZ * sizeof(int));
    udata->csr_jac_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));
    udata->csr_val_d = (amrex::Real*)amrex::The_Arena()->alloc(
      udata->NNZ * a_ncells * sizeof(amrex::Real));

    SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
      udata->csr_col_index_h, udata->csr_row_count_h, &HP, 1);

    amrex::Gpu::htod_memcpy(
      &udata->csr_col_index_d, &udata->csr_col_index_h,
      sizeof(udata->NNZ * sizeof(int)));
    amrex::Gpu::htod_memcpy(
      &udata->csr_row_count_d, &udata->csr_row_count_h,
      sizeof((NUM_SPECIES + 2) * sizeof(int)));

    size_t workspaceInBytes = 0;
    size_t internalDataInBytes = 0;

    cusolverStatus_t cusolver_status = CUSOLVER_STATUS_SUCCESS;
    cusolver_status = cusolverSpCreate(&(udata->cusolverHandle));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    cusolver_status = cusolverSpSetStream(udata->cusolverHandle, stream);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    cusparseStatus_t cusparse_status = CUSPARSE_STATUS_SUCCESS;
    cusparse_status = cusparseCreateMatDescr(&(udata->descrA));
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatType(udata->descrA, CUSPARSE_MATRIX_TYPE_GENERAL);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusparse_status =
      cusparseSetMatIndexBase(udata->descrA, CUSPARSE_INDEX_BASE_ONE);
    AMREX_ASSERT(cusparse_status == CUSPARSE_STATUS_SUCCESS);
    cusolver_status = cusolverSpCreateCsrqrInfo(&(udata->info));
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    // symbolic analysis
    cusolver_status = cusolverSpXcsrqrAnalysisBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_row_count_h, udata->csr_col_index_h,
      udata->info);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);

    /*
    size_t free_mem = 0;
    size_t total_mem = 0;
    cudaStat1 = cudaMemGetInfo( &free_mem, &total_mem );
    AMREX_ASSERT( cudaSuccess == cudaStat1 );
    std::cout<<"(AFTER SA) Free: "<< free_mem<< " Tot: "<<total_mem<<std::endl;
    */

    // allocate working space
    cusolver_status = cusolverSpDcsrqrBufferInfoBatched(
      udata->cusolverHandle,
      NUM_SPECIES + 1, // size per subsystem
      NUM_SPECIES + 1, // size per subsystem
      udata->NNZ, udata->descrA, udata->csr_val_d, udata->csr_row_count_h,
      udata->csr_col_index_h, a_ncells, udata->info, &internalDataInBytes,
      &workspaceInBytes);
    AMREX_ASSERT(cusolver_status == CUSOLVER_STATUS_SUCCESS);
    // amrex::Print() << " BufferInfo workspaceInBytes " << workspaceInBytes <<
    // "\n";

    cudaError_t cudaStat1 = cudaSuccess;
    cudaStat1 = cudaMalloc((void**)&(udata->buffer_qr), workspaceInBytes);
    AMREX_ASSERT(cudaStat1 == cudaSuccess);
#else
    amrex::Abort(
      "cuSparse_simplified_AJacobian is only available with CUDA on GPU");
#endif
  }

#else
  if (udata->precond_type == cvode::denseSimpleAJac) {
    // Matrix data : big bunch of dimensions, not sure why. Generally ncells ==
    // 1 so not too bad Simply create the space.
    (udata->P) = new amrex::Real***[udata->ncells];
    (udata->Jbd) = new amrex::Real***[udata->ncells];
    (udata->pivot) = new sunindextype**[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i] = new amrex::Real**[udata->ncells];
      (udata->Jbd)[i] = new amrex::Real**[udata->ncells];
      (udata->pivot)[i] = new sunindextype*[udata->ncells];
    }
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->P)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->Jbd)[i][i] =
        SUNDlsMat_newDenseMat(NUM_SPECIES + 1, NUM_SPECIES + 1);
      (udata->pivot)[i][i] = SUNDlsMat_newIndexArray(NUM_SPECIES + 1);
    }
  } else if (udata->precond_type == cvode::sparseSimpleAJac) {
#ifdef PELE_USE_KLU
    // CSC matrices data for each submatrix (cells)
    udata->colPtrs = new int*[udata->ncells];
    udata->rowVals = new int*[udata->ncells];
    udata->Jdata = new amrex::Real*[udata->ncells];

    // KLU internal storage
    udata->Common = new klu_common[udata->ncells];
    udata->Symbolic = new klu_symbolic*[udata->ncells];
    udata->Numeric = new klu_numeric*[udata->ncells];
    // Sparse Matrices for It Sparse KLU block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    // Not used yet. TODO use to fetch sparse Mat
    udata->indx = new int[udata->NNZ];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSC_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->colPtrs[i] = (int*)SUNSparseMatrix_IndexPointers((udata->PS)[i]);
      udata->rowVals[i] = (int*)SUNSparseMatrix_IndexValues((udata->PS)[i]);
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      // indx not used YET
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSC(
        udata->rowVals[i], udata->colPtrs[i], udata->indx, &HP);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
      klu_defaults(&(udata->Common[i]));
      // udata->Common.btf = 0;
      //(udata->Common[i]).maxwork = 15;
      // udata->Common.ordering = 1;
      udata->Symbolic[i] = klu_analyze(
        NUM_SPECIES + 1, udata->colPtrs[i], udata->rowVals[i],
        &(udata->Common[i]));
    }
#endif
  } else if (udata->precond_type == cvode::customSimpleAJac) {
    // CSR matrices data for each submatrix (cells)
    udata->colVals = new int*[udata->ncells];
    udata->rowPtrs = new int*[udata->ncells];
    // Matrices for each sparse custom block-solve
    udata->PS = new SUNMatrix[udata->ncells];
    udata->JSPSmat = new amrex::Real*[udata->ncells];
    // Number of non zero elements
    SPARSITY_INFO_SYST_SIMPLIFIED(&(udata->NNZ), &HP);
    for (int i = 0; i < udata->ncells; ++i) {
      (udata->PS)[i] = SUNSparseMatrix(
        NUM_SPECIES + 1, NUM_SPECIES + 1, udata->NNZ, CSR_MAT,
        *amrex::sundials::The_Sundials_Context());
      udata->rowPtrs[i] =
        static_cast<int*>(SUNSparseMatrix_IndexPointers((udata->PS)[i]));
      udata->colVals[i] =
        static_cast<int*>(SUNSparseMatrix_IndexValues((udata->PS)[i]));
      udata->Jdata[i] = SUNSparseMatrix_Data((udata->PS)[i]);
      SPARSITY_PREPROC_SYST_SIMPLIFIED_CSR(
        udata->colVals[i], udata->rowPtrs[i], &HP, 0);
      udata->JSPSmat[i] =
        new amrex::Real[(NUM_SPECIES + 1) * (NUM_SPECIES + 1)];
    }
  }
#endif
}